

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

int QProcess::execute(QString *program,QStringList *arguments)

{
  bool bVar1;
  QProcessPrivate *d;
  int iVar2;
  long in_FS_OFFSET;
  QProcess local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super_QIODevice.super_QObject._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.super_QIODevice.super_QObject.d_ptr.d = (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QProcess(&local_38,(QObject *)0x0);
  *(undefined1 *)((long)&local_38.super_QIODevice.super_QObject.d_ptr.d[8].children.d.ptr + 7) = 2;
  start(&local_38,program,arguments,(OpenMode)0x3);
  bVar1 = waitForFinished(&local_38,-1);
  iVar2 = -2;
  if (((bVar1) &&
      (*(char *)((long)&local_38.super_QIODevice.super_QObject.d_ptr.d[8].children.d.ptr + 6) !=
       '\0')) &&
     (iVar2 = -1,
     *(char *)((long)&local_38.super_QIODevice.super_QObject.d_ptr.d[8].children.d.ptr + 5) == '\0')
     ) {
    iVar2 = *(int *)&local_38.super_QIODevice.super_QObject.d_ptr.d[8].children.d.ptr;
  }
  ~QProcess(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QProcess::execute(const QString &program, const QStringList &arguments)
{
    QProcess process;
    process.setProcessChannelMode(ForwardedChannels);
    process.start(program, arguments);
    if (!process.waitForFinished(-1) || process.error() == FailedToStart)
        return -2;
    return process.exitStatus() == QProcess::NormalExit ? process.exitCode() : -1;
}